

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSetNonStationary.cpp
# Opt level: O2

size_t __thiscall BeliefSetNonStationary::Size(BeliefSetNonStationary *this)

{
  size_t sVar1;
  size_t sVar2;
  Index t;
  ulong uVar3;
  
  sVar2 = 0;
  for (uVar3 = 0;
      ((long)(this->_m_beliefSets).
             super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_m_beliefSets).
            super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) / 0x18 != uVar3;
      uVar3 = (ulong)((Index)uVar3 + 1)) {
    sVar1 = Size(this,(Index)uVar3);
    sVar2 = sVar2 + sVar1;
  }
  return sVar2;
}

Assistant:

size_t BeliefSetNonStationary::Size() const
{
    size_t size=0;
    for(Index t=0;t!=_m_beliefSets.size();++t)
        size+=Size(t);
    return(size);
}